

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

Expression *
parseExpression(Expression *__return_storage_ptr__,Tokenizer *tokenizer,bool inUnknownOrFalseBlock)

{
  bool bVar1;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_50 [3];
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> local_38;
  undefined1 local_30 [8];
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  TokenizerPosition pos;
  bool inUnknownOrFalseBlock_local;
  Tokenizer *tokenizer_local;
  
  exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       Tokenizer::getPosition(tokenizer);
  expression((Tokenizer *)local_30);
  bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)local_30,(nullptr_t)0x0);
  if (bVar1) {
    local_38.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
    super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
         (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
         exp._M_t.
         super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
         super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
         super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
    Tokenizer::setPosition
              (tokenizer,
               (TokenizerPosition)
               exp._M_t.
               super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
               _M_t.
               super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
               .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl);
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
            (local_50,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                      local_30);
  Expression::Expression(__return_storage_ptr__,local_50,inUnknownOrFalseBlock);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            (local_50);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Expression parseExpression(Tokenizer& tokenizer, bool inUnknownOrFalseBlock)
{
	TokenizerPosition pos = tokenizer.getPosition();

	// parse expression, revert tokenizer to previous position
	// if it failed
	std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
	if (exp == nullptr)
		tokenizer.setPosition(pos);

	return Expression(std::move(exp), inUnknownOrFalseBlock);
}